

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O1

void __thiscall QCborValue::QCborValue(QCborValue *this,QString *s)

{
  char16_t *pcVar1;
  qsizetype qVar2;
  QCborContainerPrivate *this_00;
  QStringView s_00;
  
  pcVar1 = (s->d).ptr;
  qVar2 = (s->d).size;
  *(undefined8 *)this = 0;
  this_00 = (QCborContainerPrivate *)operator_new(0x40);
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i = 0;
  this_00->usedData = 0;
  (this_00->data).d.d = (Data *)0x0;
  (this_00->data).d.ptr = (char *)0x0;
  (this_00->data).d.size = 0;
  (this_00->elements).d.d = (Data *)0x0;
  (this_00->elements).d.ptr = (Element *)0x0;
  (this_00->elements).d.size = 0;
  *(QCborContainerPrivate **)(this + 8) = this_00;
  *(undefined4 *)(this + 0x10) = 0x60;
  s_00.m_data = pcVar1;
  s_00.m_size = qVar2;
  QCborContainerPrivate::append(this_00,s_00);
  **(undefined4 **)(this + 8) = 1;
  return;
}

Assistant:

QCborValue::QCborValue(const QString &s) : QCborValue(qToStringViewIgnoringNull(s)) {}